

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContinuousPageStack.h
# Opt level: O3

AssertionInfo * __thiscall
ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>::Iterator::operator*
          (Iterator *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ulong uVar4;
  ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL> *pCVar5;
  
  uVar4 = (this->super_Iterator).nextTop;
  if (uVar4 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                       ,0x142,"(*this)","*this");
    if (!bVar2) goto LAB_00efc2c6;
    *puVar3 = 0;
    uVar4 = (this->super_Iterator).nextTop;
  }
  pCVar5 = this->stack;
  if ((pCVar5->super_ContinuousPageStack<1UL>).nextTop < uVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                       ,0x143,"(this->nextTop <= stack.nextTop)","this->nextTop <= stack.nextTop");
    if (!bVar2) goto LAB_00efc2c6;
    *puVar3 = 0;
    pCVar5 = this->stack;
  }
  if ((pCVar5->super_ContinuousPageStack<1UL>).bufferSize == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                       ,199,"(bufferSize)","bufferSize");
    if (!bVar2) {
LAB_00efc2c6:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return (AssertionInfo *)
         ((long)&((pCVar5->super_ContinuousPageStack<1UL>).pageAllocation)->pageCount +
         (this->super_Iterator).nextTop);
}

Assistant:

inline T &ContinuousPageStackOfFixedElements<T, InitialPageCount>::Iterator::operator *() const
{
    Assert(*this);
    Assert(this->nextTop <= stack.nextTop);
    return *reinterpret_cast<T *>(&stack.Buffer()[this->nextTop - sizeof(T)]);
}